

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O1

bool __thiscall
QHttpHeaders::replaceOrAppend(QHttpHeaders *this,QAnyStringView name,QAnyStringView newValue)

{
  QHttpHeadersPrivate *pQVar1;
  QByteArray value;
  bool bVar2;
  long in_FS_OFFSET;
  QArrayData *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90 [16];
  anon_class_1_0_00000001 local_59;
  HeaderName local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QHttpHeadersPrivate *)0x0) || ((pQVar1->headers).d.size == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      bVar2 = append(this,name,newValue);
      return bVar2;
    }
    goto LAB_0018ef4b;
  }
  bVar2 = isValidHttpHeaderNameField(name);
  if (bVar2) {
    bVar2 = isValidHttpHeaderValueField(newValue);
    if (!bVar2) goto LAB_0018ef2a;
    HeaderName::HeaderName(&local_58,name);
    normalizedValue((QByteArray *)&stack0xffffffffffffff88,newValue);
    value.d.ptr = (char *)in_stack_ffffffffffffff90._0_8_;
    value.d.size = in_stack_ffffffffffffff90._8_8_;
    value.d.d = (Data *)in_stack_ffffffffffffff88;
    QHttpHeadersPrivate::replaceOrAppend(&this->d,&local_58,value);
    if (in_stack_ffffffffffffff88 != (QArrayData *)0x0) {
      LOCK();
      (in_stack_ffffffffffffff88->ref_)._q_value.super___atomic_base<int>._M_i =
           (in_stack_ffffffffffffff88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((in_stack_ffffffffffffff88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(in_stack_ffffffffffffff88,1,0x10);
      }
    }
    if ((long)(char)local_58.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index
        != -1) {
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
        ::_S_vtable._M_arr
        [(char)local_58.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index].
        _M_data)(&local_59,&local_58.data);
      local_58.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index = 0xff;
    }
    bVar2 = true;
  }
  else {
LAB_0018ef2a:
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
LAB_0018ef4b:
  __stack_chk_fail();
}

Assistant:

bool QHttpHeaders::replaceOrAppend(QAnyStringView name, QAnyStringView newValue)
{
    if (isEmpty())
        return append(name, newValue);

    if (!isValidHttpHeaderNameField(name) || !isValidHttpHeaderValueField(newValue))
        return false;

    QHttpHeadersPrivate::replaceOrAppend(d, HeaderName{name}, normalizedValue(newValue));
    return true;
}